

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (string *test_suite_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc,TestFactoryBase *factory)

{
  TestInfo *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  TestInfo *test_info;
  CodeLocation *in_stack_fffffffffffffee8;
  CodeLocation *in_stack_fffffffffffffef0;
  TestInfo *test_info_00;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 uVar1;
  SetUpTestSuiteFunc in_stack_ffffffffffffff48;
  UnitTestImpl *in_stack_ffffffffffffff50;
  CodeLocation *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  TestInfo *in_stack_ffffffffffffffb0;
  TypeId in_stack_ffffffffffffffc0;
  TestFactoryBase *in_stack_ffffffffffffffc8;
  
  __s = (TestInfo *)operator_new(0x110);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,in_RDI);
  test_info_00 = (TestInfo *)&stack0xffffffffffffff87;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,(char *)__s,(allocator<char> *)in_RDI);
  CodeLocation::CodeLocation(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  TestInfo::TestInfo(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8);
  uVar1 = 0;
  CodeLocation::~CodeLocation((CodeLocation *)0x18d999);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  GetUnitTestImpl();
  UnitTestImpl::AddTestInfo
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (TearDownTestSuiteFunc)CONCAT17(uVar1,in_stack_ffffffffffffff40),test_info_00);
  return __s;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    std::string test_suite_name, const char* name, const char* type_param,
    const char* value_param, CodeLocation code_location,
    TypeId fixture_class_id, SetUpTestSuiteFunc set_up_tc,
    TearDownTestSuiteFunc tear_down_tc, TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(std::move(test_suite_name), name, type_param, value_param,
                   std::move(code_location), fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}